

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

TimingCheckArgSyntax * __thiscall slang::parsing::Parser::parseTimingCheckArg(Parser *this)

{
  bool bVar1;
  int iVar2;
  EmptyTimingCheckArgSyntax *pEVar3;
  SourceLocation SVar4;
  ExpressionTimingCheckArgSyntax *pEVar5;
  undefined8 uVar6;
  EdgeDescriptorSyntax *pEVar7;
  undefined4 extraout_var;
  EdgeControlSpecifierSyntax *controlSpecifier;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar10;
  Diagnostic *pDVar11;
  NameSyntax *expr;
  ExpressionSyntax *pEVar12;
  TimingCheckEventConditionSyntax *condition;
  TimingCheckEventArgSyntax *pTVar13;
  Info *pIVar14;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  TokenKind kind;
  ulong uVar15;
  Token TVar16;
  Token TVar17;
  Token TVar18;
  SourceRange SVar19;
  string_view arg;
  Token edge_00;
  Token closeBracket;
  Token edge;
  Token openBracket;
  Token local_230;
  Token local_220;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_210;
  undefined1 local_200;
  Token local_1f8;
  Token local_1e8;
  Token local_1d8;
  undefined1 local_1c8 [8];
  Info *pIStack_1c0;
  SyntaxNode *local_1b8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Stack_1b0;
  pointer local_1a0;
  __extent_storage<18446744073709551615UL> local_198;
  pointer pTVar8;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis), bVar1)) {
    TVar16 = ParserBase::placeholderToken(&this->super_ParserBase);
    pEVar3 = slang::syntax::SyntaxFactory::emptyTimingCheckArg(&this->factory,TVar16);
    return &pEVar3->super_TimingCheckArgSyntax;
  }
  local_220 = parseEdgeKeyword(this);
  if (local_220.info == (Info *)0x0) {
    expr = (NameSyntax *)
           parseMinTypMaxExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    bVar1 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
    if (!bVar1) {
      pEVar5 = slang::syntax::SyntaxFactory::expressionTimingCheckArg
                         (&this->factory,(ExpressionSyntax *)expr);
      return &pEVar5->super_TimingCheckArgSyntax;
    }
    TVar16 = ParserBase::consume(&this->super_ParserBase);
    pEVar12 = parseExpression(this);
    condition = slang::syntax::SyntaxFactory::timingCheckEventCondition
                          (&this->factory,TVar16,pEVar12);
    Token::Token(&local_1d8);
    controlSpecifier = (EdgeControlSpecifierSyntax *)0x0;
    goto LAB_0067d5c0;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
  if (bVar1) {
    Token::Token(&local_1f8);
    Token::Token(&local_230);
    local_1f8 = ParserBase::expect(&this->super_ParserBase,OpenBracket);
    if ((local_1f8._0_4_ >> 0x10 & 1) == 0) {
      local_1c8 = (undefined1  [8])&_Stack_1b0;
      pIStack_1c0 = (Info *)0x0;
      local_1b8 = (SyntaxNode *)0x10;
      TVar16 = ParserBase::peek(&this->super_ParserBase);
      local_1e8 = TVar16;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfBracketedList(TVar16.kind);
      if (bVar1) {
        bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar1) {
          SVar4 = Token::location(&local_1e8);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x3a0005,SVar4);
        }
LAB_0067d2f8:
        local_230 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
        pIVar14 = local_230.info;
      }
      else {
        bVar1 = slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor(TVar16.kind);
        if (bVar1) {
          local_210._M_rest =
               (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseEdgeDescriptor(this);
          local_200 = 1;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar17 = ParserBase::peek(&this->super_ParserBase);
          uVar6 = TVar17._0_8_;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfBracketedList(TVar17.kind);
          if (TVar17.kind != EndOfFile && !bVar1) {
            do {
              if ((short)uVar6 != 0x18) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor,&slang::syntax::SyntaxFacts::isEndOfBracketedList>
                                    (&this->super_ParserBase,(DiagCode)0x3a0005,false);
                  if (!bVar1) goto LAB_0067d2f8;
                  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar1);
              }
              local_210._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_200 = 0;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_210._M_first);
              TVar17 = ParserBase::peek(&this->super_ParserBase);
              kind = TVar17.kind;
              bVar1 = slang::syntax::SyntaxFacts::isEndOfBracketedList(kind);
              if (kind == EndOfFile || bVar1) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                break;
              }
              if ((TVar16.info == TVar17.info && TVar16.kind == kind) &&
                 (bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleEdgeDescriptor,&slang::syntax::SyntaxFacts::isEndOfBracketedList>
                                    (&this->super_ParserBase,(DiagCode)0x3a0005,true), !bVar1))
              break;
              pEVar7 = parseEdgeDescriptor(this);
              local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar7;
              local_200 = 1;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_210._M_first);
              TVar18 = ParserBase::peek(&this->super_ParserBase);
              uVar6 = TVar18._0_8_;
              bVar1 = slang::syntax::SyntaxFacts::isEndOfBracketedList(TVar18.kind);
              uVar15 = TVar17._0_8_ & 0xffffffff;
              TVar16.info = TVar17.info;
              TVar16.kind = (short)uVar15;
              TVar16._2_1_ = (char)(uVar15 >> 0x10);
              TVar16.numFlags.raw = (char)(uVar15 >> 0x18);
              TVar16.rawLen = (int)(uVar15 >> 0x20);
            } while (TVar18.kind != EndOfFile && !bVar1);
          }
          goto LAB_0067d2f8;
        }
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar16,CloseBracket,&local_230,(DiagCode)0x3a0005);
        pIVar14 = extraout_RDX;
      }
      iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar14);
      pTVar8 = (pointer)CONCAT44(extraout_var,iVar2);
      if (local_1c8 != (undefined1  [8])&_Stack_1b0) {
        operator_delete((void *)local_1c8);
      }
      pIVar14 = extraout_RDX_00;
    }
    else {
      SVar4 = Token::location(&local_1f8);
      local_230 = ParserBase::missingToken(&this->super_ParserBase,CloseBracket,SVar4);
      pIVar14 = (Info *)0x0;
      pTVar8 = (pointer)0x0;
    }
    pIStack_1c0 = (Info *)CONCAT44(pIStack_1c0._4_4_,3);
    local_1b8 = (SyntaxNode *)0x0;
    _Stack_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    local_1c8 = (undefined1  [8])&PTR_getChild_00c954b8;
    _Stack_1b0._M_first._M_storage.info = pIVar14;
    local_1a0 = pTVar8;
    local_198._M_extent_value = (size_t)pIVar14;
    controlSpecifier =
         slang::syntax::SyntaxFactory::edgeControlSpecifier
                   (&this->factory,local_1f8,
                    (SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)local_1c8,local_230)
    ;
    if ((Info *)0xb < pIVar14) {
      if (*(__index_type *)
           ((long)&pTVar8[0xb].super_ConstTokenOrSyntax.
                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .
                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
           + 0x10) == '\x01') {
        ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             (pTVar8 + 0xb));
        SVar19 = slang::syntax::SyntaxNode::sourceRange(*ppSVar9);
      }
      else {
        pvVar10 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             (pTVar8 + 0xb));
        local_1c8 = *(undefined1 (*) [8])pvVar10;
        pIStack_1c0 = pvVar10->info;
        SVar19 = Token::range((Token *)local_1c8);
      }
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa90005,SVar19);
    }
    if (local_220.kind != EdgeKeyword) {
      SVar19 = Token::range(&local_220);
      pDVar11 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x280005,SVar19);
      arg = Token::valueText(&local_220);
      pDVar11 = Diagnostic::operator<<(pDVar11,arg);
      SVar19 = slang::syntax::SyntaxNode::sourceRange(&controlSpecifier->super_SyntaxNode);
      Diagnostic::operator<<(pDVar11,SVar19);
    }
  }
  else {
    controlSpecifier = (EdgeControlSpecifierSyntax *)0x0;
  }
  expr = parseName(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
  if (bVar1) {
    TVar16 = ParserBase::consume(&this->super_ParserBase);
    pEVar12 = parseExpression(this);
    condition = slang::syntax::SyntaxFactory::timingCheckEventCondition
                          (&this->factory,TVar16,pEVar12);
  }
  else {
    condition = (TimingCheckEventConditionSyntax *)0x0;
  }
  local_1d8.info = local_220.info;
  local_1d8._0_8_ = local_220._0_8_;
LAB_0067d5c0:
  edge_00.info = local_1d8.info;
  edge_00.kind = local_1d8.kind;
  edge_00._2_1_ = local_1d8._2_1_;
  edge_00.numFlags.raw = local_1d8.numFlags.raw;
  edge_00.rawLen = local_1d8.rawLen;
  pTVar13 = slang::syntax::SyntaxFactory::timingCheckEventArg
                      (&this->factory,edge_00,controlSpecifier,&expr->super_ExpressionSyntax,
                       condition);
  return &pTVar13->super_TimingCheckArgSyntax;
}

Assistant:

TimingCheckArgSyntax& Parser::parseTimingCheckArg() {
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyTimingCheckArg(placeholderToken());

    auto parseCondition = [&]() -> TimingCheckEventConditionSyntax* {
        if (!peek(TokenKind::TripleAnd))
            return nullptr;

        // The syntax in the BNF for condition expressions is nonsensical,
        // and there is some discussion in the Mantis tracker about how it's
        // a holdover from Verilog-XL and should likely be replaced with just
        // a plain old expression, so that's what we're doing here.
        auto tripleAnd = consume();
        auto& expr = parseExpression();
        return &factory.timingCheckEventCondition(tripleAnd, expr);
    };

    auto edge = parseEdgeKeyword();
    if (edge) {
        EdgeControlSpecifierSyntax* control = nullptr;
        if (peek(TokenKind::OpenBracket)) {
            Token openBracket, closeBracket;
            std::span<TokenOrSyntax> list;
            parseList<isPossibleEdgeDescriptor, isEndOfBracketedList>(
                TokenKind::OpenBracket, TokenKind::CloseBracket, TokenKind::Comma, openBracket,
                list, closeBracket, RequireItems::True, diag::ExpectedEdgeDescriptor,
                [this] { return &parseEdgeDescriptor(); });

            control = &factory.edgeControlSpecifier(openBracket, list, closeBracket);

            // List is allowed to have up to 6 specifiers (plus 5 commas)
            if (list.size() > 11) {
                auto& lastDesc = list[11];
                auto range = lastDesc.isNode() ? lastDesc.node()->sourceRange()
                                               : lastDesc.token().range();
                addDiag(diag::TooManyEdgeDescriptors, range);
            }

            if (edge.kind != TokenKind::EdgeKeyword) {
                addDiag(diag::EdgeDescWrongKeyword, edge.range())
                    << edge.valueText() << control->sourceRange();
            }
        }

        auto& terminal = parseName();
        auto cond = parseCondition();
        return factory.timingCheckEventArg(edge, control, terminal, cond);
    }

    auto& expr = parseMinTypMaxExpression();
    auto cond = parseCondition();
    if (cond)
        return factory.timingCheckEventArg(Token(), nullptr, expr, cond);

    else
        return factory.expressionTimingCheckArg(expr);
}